

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

bool tfs::setupDnn2(Dnn *dnn)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  unsigned_long uVar6;
  Dnn *in_RDI;
  unsigned_long count;
  DnnBuilder builder;
  unsigned_long in_stack_ffffffffffffff98;
  Dnn *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  DnnBuilder *this;
  undefined7 in_stack_ffffffffffffffc0;
  DnnBuilder *in_stack_ffffffffffffffc8;
  DnnBuilder local_20;
  bool local_1;
  
  this = &local_20;
  DnnBuilder::DnnBuilder(this,in_RDI,ACTIVATION_RELU);
  uVar1 = DnnBuilder::addLayerInput
                    ((DnnBuilder *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,
                                       CONCAT15(in_stack_ffffffffffffffb5,
                                                CONCAT14(in_stack_ffffffffffffffb4,
                                                         CONCAT13(in_stack_ffffffffffffffb3,
                                                                  CONCAT12(in_stack_ffffffffffffffb2
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0))))))),
                     CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,
                                       CONCAT15(in_stack_ffffffffffffffad,
                                                CONCAT14(in_stack_ffffffffffffffac,
                                                         CONCAT13(in_stack_ffffffffffffffab,
                                                                  CONCAT12(in_stack_ffffffffffffffaa
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffffa9,
                                                  in_stack_ffffffffffffffa8))))))),
                     (unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((bool)uVar1) {
    uVar2 = DnnBuilder::addLayerConvolution
                      (in_stack_ffffffffffffffc8,CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                       (unsigned_long)this,
                       CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT15(in_stack_ffffffffffffffb5,
                                                  CONCAT14(in_stack_ffffffffffffffb4,
                                                           CONCAT13(in_stack_ffffffffffffffb3,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0))))))),
                       CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT15(in_stack_ffffffffffffffad,
                                                  CONCAT14(in_stack_ffffffffffffffac,
                                                           CONCAT13(in_stack_ffffffffffffffab,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8))))))),
                       (Activation)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    if ((bool)uVar2) {
      uVar3 = DnnBuilder::addLayerPool
                        ((DnnBuilder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x118526)
      ;
      if ((bool)uVar3) {
        uVar4 = DnnBuilder::addLayerConvolution
                          (in_stack_ffffffffffffffc8,CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                           (unsigned_long)this,
                           CONCAT17(in_stack_ffffffffffffffb7,
                                    CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                            CONCAT14(uVar3,CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                           ,CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,
                                              CONCAT15(in_stack_ffffffffffffffad,
                                                       CONCAT14(in_stack_ffffffffffffffac,
                                                                CONCAT13(in_stack_ffffffffffffffab,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8))))))),
                           (Activation)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        if ((bool)uVar4) {
          bVar5 = DnnBuilder::addLayerPool
                            ((DnnBuilder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                             0x118604);
          if (bVar5) {
            uVar1 = DnnBuilder::addLayerConvolution
                              (in_stack_ffffffffffffffc8,CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                               (unsigned_long)this,
                               CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                                CONCAT14(uVar3,CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(uVar4,CONCAT11(in_stack_ffffffffffffffb1,
                                                                          bVar5))))))),
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                               ,(Activation)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
            if ((bool)uVar1) {
              bVar5 = DnnBuilder::addLayerPool
                                ((DnnBuilder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                 0x1186e2);
              if (bVar5) {
                bVar5 = DnnBuilder::addLayerSoftmax
                                  ((DnnBuilder *)
                                   CONCAT17(in_stack_ffffffffffffffaf,
                                            CONCAT16(uVar1,CONCAT15(in_stack_ffffffffffffffad,
                                                                    CONCAT14(bVar5,CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                                   ,(unsigned_long)in_stack_ffffffffffffffa0);
                if (bVar5) {
                  Dnn::initialize(in_stack_ffffffffffffffa0);
                  uVar6 = Dnn::count((Dnn *)0x1187ae);
                  report_message("Info ",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                 ,"setupDnn2",0x48,"We have set up %lu layers",uVar6);
                  local_1 = true;
                }
                else {
                  local_1 = report_problem("Error",
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                           ,"setupDnn2",0x44,"Cannot add Softmax layer");
                }
              }
              else {
                local_1 = report_problem("Error",
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                         ,"setupDnn2",0x41,"Cannot add Pool layer");
              }
            }
            else {
              local_1 = report_problem("Error",
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                       ,"setupDnn2",0x3e,"Cannot add Convolution layer");
            }
          }
          else {
            local_1 = report_problem("Error",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                     ,"setupDnn2",0x3b,"Cannot add Pool layer");
          }
        }
        else {
          local_1 = report_problem("Error",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                   ,"setupDnn2",0x38,"Cannot add Convolution layer");
        }
      }
      else {
        local_1 = report_problem("Error",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                                 ,"setupDnn2",0x35,"Cannot add Pool layer");
      }
    }
    else {
      local_1 = report_problem("Error",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                               ,"setupDnn2",0x32,"Cannot add Convolution layer");
    }
  }
  else {
    local_1 = report_problem("Error",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                             ,"setupDnn2",0x2f,"Cannot add Input layer");
  }
  DnnBuilder::~DnnBuilder(&local_20);
  return (bool)(local_1 & 1);
}

Assistant:

static bool
    setupDnn2( Dnn &dnn ) {
        DnnBuilder builder( dnn, ACTIVATION_RELU );
        if( !builder.addLayerInput( 159, 119, 3 )) {            // Input layer: 159x119x3
            return log_error( "Cannot add Input layer" );
        }
        if( !builder.addLayerConvolution( 5, 16, 1, 2 )) {      // sx:5, filters:16, stride:1, pad:2
            return log_error( "Cannot add Convolution layer" );
        }
        if( !builder.addLayerPool( 2, 2 )) {                    // sx:2, stride:2
            return log_error( "Cannot add Pool layer" );
        }
        if( !builder.addLayerConvolution( 5, 20, 1, 2 )) {      // sx:5, filters:20, stride:1, pad:2
            return log_error( "Cannot add Convolution layer" );
        }
        if( !builder.addLayerPool( 2, 2 )) {                    // sx:2, stride:2
            return log_error( "Cannot add Pool layer" );
        }
        if( !builder.addLayerConvolution( 5, 20, 1, 2 )) {      // sx:5, filters:20, stride:1, pad:2
            return log_error( "Cannot add Convolution layer" );
        }
        if( !builder.addLayerPool( 2, 2 )) {                    // sx:2, stride:2
            return log_error( "Cannot add Pool layer" );
        }
        if( !builder.addLayerSoftmax( 10 )) {                   // Output classifier, 10 classes (digits 0 to 9)
            return log_error( "Cannot add Softmax layer" );
        }
        dnn.initialize();                                       // Randomize the weights.
        const unsigned long count = dnn.count();
        log_info( "We have set up %lu layers", count );
        return true;
    }